

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_189743::CBBTest_Basic_Test::TestBody(CBBTest_Basic_Test *this)

{
  int iVar1;
  char *message;
  char *in_R9;
  UniquePtr<uint8_t> scoper;
  ScopedCBB cbb;
  size_t buf_len;
  uint8_t *buf;
  __uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter> local_98;
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  Bytes local_80;
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  CBB local_50;
  size_t local_20;
  _Head_base<0UL,_unsigned_char_*,_false> local_18;
  
  CBB_zero(&local_50);
  iVar1 = CBB_init(&local_50,100);
  local_90[0] = iVar1 != 0;
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_70,(internal *)local_90,(AssertionResult *)"CBB_init(cbb.get(), 100)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x173,(char *)CONCAT71(local_70._1_7_,local_70[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_80);
  }
  else {
    CBB_cleanup(&local_50);
    CBB_zero(&local_50);
    iVar1 = CBB_init(&local_50,0);
    local_90[0] = iVar1 != 0;
    local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)local_90,(AssertionResult *)"CBB_init(cbb.get(), 0)"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x176,(char *)CONCAT71(local_70._1_7_,local_70[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_80);
    }
    else {
      iVar1 = CBB_add_zeros(&local_50,0);
      local_90[0] = iVar1 != 0;
      local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&local_80);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_70,(internal *)local_90,
                   (AssertionResult *)"CBB_add_zeros(cbb.get(), 0)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_98,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x177,(char *)CONCAT71(local_70._1_7_,local_70[0]));
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_80);
      }
      else {
        iVar1 = CBB_add_u8(&local_50,'\x01');
        local_90[0] = iVar1 != 0;
        local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&local_80);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_70,(internal *)local_90,
                     (AssertionResult *)"CBB_add_u8(cbb.get(), 1)","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_98,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                     ,0x178,(char *)CONCAT71(local_70._1_7_,local_70[0]));
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_80)
          ;
        }
        else {
          iVar1 = CBB_add_u16(&local_50,0x203);
          local_90[0] = iVar1 != 0;
          local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_70,(internal *)local_90,
                       (AssertionResult *)"CBB_add_u16(cbb.get(), 0x203)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_98,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                       ,0x179,(char *)CONCAT71(local_70._1_7_,local_70[0]));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_98,(Message *)&local_80);
          }
          else {
            iVar1 = CBB_add_u24(&local_50,0x40506);
            local_90[0] = iVar1 != 0;
            local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar1 == 0) {
              testing::Message::Message((Message *)&local_80);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_70,(internal *)local_90,
                         (AssertionResult *)"CBB_add_u24(cbb.get(), 0x40506)","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_98,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                         ,0x17a,(char *)CONCAT71(local_70._1_7_,local_70[0]));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_98,(Message *)&local_80);
            }
            else {
              iVar1 = CBB_add_u32(&local_50,0x708090a);
              local_90[0] = iVar1 != 0;
              local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar1 == 0) {
                testing::Message::Message((Message *)&local_80);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_70,(internal *)local_90,
                           (AssertionResult *)"CBB_add_u32(cbb.get(), 0x708090a)","false","true",
                           in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_98,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                           ,0x17b,(char *)CONCAT71(local_70._1_7_,local_70[0]));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_98,(Message *)&local_80);
              }
              else {
                iVar1 = CBB_add_u64(&local_50,0xb0c0d0e0f101112);
                local_90[0] = iVar1 != 0;
                local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (iVar1 == 0) {
                  testing::Message::Message((Message *)&local_80);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_70,(internal *)local_90,
                             (AssertionResult *)"CBB_add_u64(cbb.get(), 0xb0c0d0e0f101112)","false",
                             "true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_98,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                             ,0x17c,(char *)CONCAT71(local_70._1_7_,local_70[0]));
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_98,(Message *)&local_80);
                }
                else {
                  iVar1 = CBB_add_bytes(&local_50,(uint8_t *)"\x13\x14",2);
                  local_90[0] = iVar1 != 0;
                  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (iVar1 == 0) {
                    testing::Message::Message((Message *)&local_80);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_70,(internal *)local_90,
                               (AssertionResult *)
                               "CBB_add_bytes(cbb.get(), (const uint8_t *)\"\\x13\\x14\", 2)",
                               "false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_98,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                               ,0x17d,(char *)CONCAT71(local_70._1_7_,local_70[0]));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_98,(Message *)&local_80);
                  }
                  else {
                    iVar1 = CBB_add_u16le(&local_50,0x203);
                    local_90[0] = iVar1 != 0;
                    local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x0;
                    if (iVar1 == 0) {
                      testing::Message::Message((Message *)&local_80);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)local_70,(internal *)local_90,
                                 (AssertionResult *)"CBB_add_u16le(cbb.get(), 0x203)","false","true"
                                 ,in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_98,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                                 ,0x17e,(char *)CONCAT71(local_70._1_7_,local_70[0]));
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_98,(Message *)&local_80);
                    }
                    else {
                      iVar1 = CBB_add_u32le(&local_50,0x708090a);
                      local_90[0] = iVar1 != 0;
                      local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x0;
                      if (iVar1 == 0) {
                        testing::Message::Message((Message *)&local_80);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_70,(internal *)local_90,
                                   (AssertionResult *)"CBB_add_u32le(cbb.get(), 0x708090a)","false",
                                   "true",in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&local_98,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                                   ,0x17f,(char *)CONCAT71(local_70._1_7_,local_70[0]));
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&local_98,(Message *)&local_80);
                      }
                      else {
                        iVar1 = CBB_add_u64le(&local_50,0xb0c0d0e0f101112);
                        local_90[0] = iVar1 != 0;
                        local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)0x0;
                        if (iVar1 == 0) {
                          testing::Message::Message((Message *)&local_80);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)local_70,(internal *)local_90,
                                     (AssertionResult *)
                                     "CBB_add_u64le(cbb.get(), 0xb0c0d0e0f101112)","false","true",
                                     in_R9);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&local_98,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                                     ,0x180,(char *)CONCAT71(local_70._1_7_,local_70[0]));
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&local_98,(Message *)&local_80);
                        }
                        else {
                          iVar1 = CBB_add_zeros(&local_50,4);
                          local_90[0] = iVar1 != 0;
                          local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)0x0;
                          if (iVar1 == 0) {
                            testing::Message::Message((Message *)&local_80);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_70,(internal *)local_90,
                                       (AssertionResult *)"CBB_add_zeros(cbb.get(), 4)","false",
                                       "true",in_R9);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&local_98,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                                       ,0x181,(char *)CONCAT71(local_70._1_7_,local_70[0]));
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&local_98,(Message *)&local_80);
                          }
                          else {
                            iVar1 = CBB_finish(&local_50,&local_18._M_head_impl,&local_20);
                            local_90[0] = iVar1 != 0;
                            local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)0x0;
                            if (iVar1 != 0) {
                              local_98._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                                   (tuple<unsigned_char_*,_bssl::internal::Deleter>)
                                   (tuple<unsigned_char_*,_bssl::internal::Deleter>)
                                   local_18._M_head_impl;
                              local_90 = (undefined1  [8])0x51c4c0;
                              local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)0x26;
                              local_80.span_.data_ = local_18._M_head_impl;
                              local_80.span_.size_ = local_20;
                              testing::internal::CmpHelperEQ<Bytes,Bytes>
                                        ((internal *)local_70,"Bytes(kExpected)",
                                         "Bytes(buf, buf_len)",(Bytes *)local_90,&local_80);
                              if (local_70[0] == (internal)0x0) {
                                testing::Message::Message((Message *)local_90);
                                if (local_68 ==
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  message = "";
                                }
                                else {
                                  message = (local_68->_M_dataplus)._M_p;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&local_80,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                                           ,0x185,message);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&local_80,(Message *)local_90);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&local_80);
                                if (local_90 != (undefined1  [8])0x0) {
                                  (**(code **)(*(long *)local_90 + 8))();
                                }
                              }
                              if (local_68 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_68,local_68);
                              }
                              std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                                        ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)
                                         &local_98);
                              goto LAB_002118d0;
                            }
                            testing::Message::Message((Message *)&local_80);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_70,(internal *)local_90,
                                       (AssertionResult *)"CBB_finish(cbb.get(), &buf, &buf_len)",
                                       "false","true",in_R9);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&local_98,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                                       ,0x182,(char *)CONCAT71(local_70._1_7_,local_70[0]));
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&local_98,(Message *)&local_80);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
  }
  if ((long *)local_80.span_.data_ != (long *)0x0) {
    (**(code **)(*(long *)local_80.span_.data_ + 8))();
  }
  if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88,local_88);
  }
LAB_002118d0:
  CBB_cleanup(&local_50);
  return;
}

Assistant:

TEST(CBBTest, Basic) {
  static const uint8_t kExpected[] = {
      0x01, 0x02, 0x03, 0x04, 0x05, 0x06, 0x07, 0x08, 0x09, 0x0a,
      0x0b, 0x0c, 0x0d, 0x0e, 0x0f, 0x10, 0x11, 0x12, 0x13, 0x14,
      0x03, 0x02, 0x0a, 0x09, 0x08, 0x07, 0x12, 0x11, 0x10, 0x0f,
      0x0e, 0x0d, 0x0c, 0x0b, 0x00, 0x00, 0x00, 0x00};
  uint8_t *buf;
  size_t buf_len;

  bssl::ScopedCBB cbb;
  ASSERT_TRUE(CBB_init(cbb.get(), 100));
  cbb.Reset();

  ASSERT_TRUE(CBB_init(cbb.get(), 0));
  ASSERT_TRUE(CBB_add_zeros(cbb.get(), 0));
  ASSERT_TRUE(CBB_add_u8(cbb.get(), 1));
  ASSERT_TRUE(CBB_add_u16(cbb.get(), 0x203));
  ASSERT_TRUE(CBB_add_u24(cbb.get(), 0x40506));
  ASSERT_TRUE(CBB_add_u32(cbb.get(), 0x708090a));
  ASSERT_TRUE(CBB_add_u64(cbb.get(), 0xb0c0d0e0f101112));
  ASSERT_TRUE(CBB_add_bytes(cbb.get(), (const uint8_t *)"\x13\x14", 2));
  ASSERT_TRUE(CBB_add_u16le(cbb.get(), 0x203));
  ASSERT_TRUE(CBB_add_u32le(cbb.get(), 0x708090a));
  ASSERT_TRUE(CBB_add_u64le(cbb.get(), 0xb0c0d0e0f101112));
  ASSERT_TRUE(CBB_add_zeros(cbb.get(), 4));
  ASSERT_TRUE(CBB_finish(cbb.get(), &buf, &buf_len));

  bssl::UniquePtr<uint8_t> scoper(buf);
  EXPECT_EQ(Bytes(kExpected), Bytes(buf, buf_len));
}